

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  huffman_tree_node *phVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *fmt;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  int local_60;
  
  iVar2 = new_node(code);
  if (iVar2 < 0) {
LAB_0020fefd:
    fmt = "Unable to allocate memory for node data.";
    iVar2 = 0xc;
LAB_0020ff02:
    archive_set_error(&a->archive,iVar2,fmt);
    iVar2 = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    uVar5 = 1;
    uVar6 = 0;
    local_60 = 2;
    iVar2 = numsymbols;
    do {
      if (0 < numsymbols) {
        uVar8 = 0;
        do {
          if (uVar5 == lengths[uVar8]) {
            free(code->table);
            code->table = (huffman_table_entry *)0x0;
            if (code->maxlength < (int)uVar5) {
              code->maxlength = uVar5;
            }
            if ((int)uVar5 < code->minlength) {
              code->minlength = uVar5;
            }
            iVar4 = 0;
            iVar7 = local_60;
            do {
              phVar1 = code->tree;
              if (phVar1[iVar4].branches[0] == phVar1[iVar4].branches[1]) goto LAB_0020fed2;
              bVar9 = (uVar6 >> (iVar7 - 2U & 0x1f) & 1) != 0;
              if (phVar1[iVar4].branches[bVar9] < 0) {
                iVar3 = new_node(code);
                if (iVar3 < 0) goto LAB_0020fefd;
                iVar3 = code->numentries;
                code->numentries = iVar3 + 1;
                code->tree[iVar4].branches[bVar9] = iVar3;
              }
              phVar1 = code->tree;
              iVar4 = phVar1[iVar4].branches[bVar9];
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
            if ((phVar1[iVar4].branches[0] != -1) || (phVar1[iVar4].branches[1] != -2)) {
LAB_0020fed2:
              fmt = "Prefix found";
              iVar2 = 0x54;
              goto LAB_0020ff02;
            }
            phVar1[iVar4].branches[0] = (int)uVar8;
            phVar1[iVar4].branches[1] = (int)uVar8;
            uVar6 = uVar6 + 1;
            iVar4 = iVar2 + -1;
            bVar9 = iVar2 < 2;
            iVar2 = iVar4;
            if (bVar9) break;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)numsymbols);
      }
      uVar6 = uVar6 * 2;
      uVar5 = uVar5 + 1;
      local_60 = local_60 + 1;
    } while (uVar5 != 0x10);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0) { break; break; }
    }
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}